

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnCallIndirectExpr
          (BinaryReaderInterp *this,Index sig_index,Index table_index)

{
  Index index;
  bool bVar1;
  Location local_f8;
  Var local_d8;
  Location local_90;
  Var local_70;
  Enum local_24;
  Index local_20;
  Index local_1c;
  Index table_index_local;
  Index sig_index_local;
  BinaryReaderInterp *this_local;
  
  local_20 = table_index;
  local_1c = sig_index;
  _table_index_local = this;
  Location::Location(&local_90);
  Var::Var(&local_70,sig_index,&local_90);
  index = local_20;
  Location::Location(&local_f8);
  Var::Var(&local_d8,index,&local_f8);
  local_24 = (Enum)SharedValidator::OnCallIndirect
                             (&this->validator_,
                              (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,&local_70,
                              &local_d8);
  bVar1 = Failed((Result)local_24);
  Var::~Var(&local_d8);
  Var::~Var(&local_70);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Istream::Emit(this->istream_,CallIndirect,local_20,local_1c);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnCallIndirectExpr(Index sig_index,
                                              Index table_index) {
  CHECK_RESULT(
      validator_.OnCallIndirect(loc, Var(sig_index), Var(table_index)));
  istream_.Emit(Opcode::CallIndirect, table_index, sig_index);
  return Result::Ok;
}